

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

string * vkt::tessellation::anon_unknown_0::getProgramName
                   (string *__return_storage_ptr__,string *baseName,Winding winding,
                   bool usePointMode)

{
  ostream *poVar1;
  char *pcVar2;
  size_t sVar3;
  string *psVar4;
  long lVar5;
  char *__s;
  ostringstream str;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(baseName->_M_dataplus)._M_p,baseName->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_",1);
  pcVar2 = (char *)0x0;
  if (winding == WINDING_CW) {
    pcVar2 = "cw";
  }
  __s = "ccw";
  if (winding != WINDING_CCW) {
    __s = pcVar2;
  }
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar3);
  }
  pcVar2 = "";
  if (usePointMode) {
    pcVar2 = "_point_mode";
  }
  lVar5 = 0xb;
  if (!usePointMode) {
    lVar5 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,lVar5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  psVar4 = (string *)std::ios_base::~ios_base(local_130);
  return psVar4;
}

Assistant:

inline std::string getProgramName (const std::string& baseName, const Winding winding, const bool usePointMode)
{
	std::ostringstream str;
	str << baseName << "_" << getWindingShaderName(winding) << (usePointMode ? "_point_mode" : "");
	return str.str();
}